

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  addrinfo *paVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ssize_t sVar6;
  ostream *poVar7;
  long lVar8;
  int unaff_EBX;
  bool bVar9;
  char local_2e8 [8];
  char userInput [256];
  char buf [256];
  char local_b8 [8];
  char s [46];
  byte local_82;
  pollfd pollData [2];
  pointer local_70;
  undefined1 local_68 [16];
  addrinfo *local_58;
  addrinfo *servinfo;
  string sUserInput;
  
  if (argc != 2) {
LAB_00102826:
    poVar7 = std::operator<<((ostream *)&std::cerr,"usage: client hostname");
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(1);
  }
  buf[0xf8] = '\0';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  iVar3 = getaddrinfo(argv[1],"3491",(addrinfo *)(buf + 0xf8),&local_58);
  paVar1 = local_58;
  if (iVar3 == 0) {
    for (; paVar1 != (addrinfo *)0x0; paVar1 = paVar1->ai_next) {
      unaff_EBX = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      pcVar4 = "client: socket";
      if (unaff_EBX != -1) {
        iVar3 = connect(unaff_EBX,paVar1->ai_addr,paVar1->ai_addrlen);
        if (iVar3 != -1) break;
        close(unaff_EBX);
        pcVar4 = "client: connect";
      }
      perror(pcVar4);
    }
    if (paVar1 != (addrinfo *)0x0) {
      inet_ntop(paVar1->ai_family,
                paVar1->ai_addr->sa_data + (ulong)(paVar1->ai_addr->sa_family != 2) * 4 + 2,local_b8
                ,0x2e);
      freeaddrinfo(local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"My chat room server. Version Two.",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      s[0x2c] = '\x01';
      s[0x2d] = '\0';
      s._40_4_ = unaff_EBX;
      pollData[0].fd = fileno(_stdin);
      pollData[0].events = 1;
      pcVar4 = userInput + 0xf8;
      do {
        while( true ) {
          while( true ) {
            do {
              iVar3 = poll((pollfd *)(s + 0x28),2,500);
            } while (iVar3 == 0);
            if (iVar3 != -1) break;
            perror("Polling error");
          }
          if ((local_82 & 1) == 0) break;
          bzero(pcVar4,0x100);
          sVar6 = recv(unaff_EBX,pcVar4,0xff,0);
          iVar3 = (int)sVar6;
          if (iVar3 == -1) {
            main_cold_1();
            goto LAB_00102826;
          }
          userInput[(long)iVar3 + 0xf8] = '\0';
          if (0 < iVar3) {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
            std::ostream::put(-0x40);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"> ",2);
            std::ostream::flush();
          }
        }
        servinfo = (addrinfo *)&sUserInput._M_string_length;
        sUserInput._M_dataplus._M_p = (pointer)0x0;
        sUserInput._M_string_length._0_1_ = 0;
        cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + ' ');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&servinfo,cVar2);
        strcpy(local_2e8,(char *)servinfo);
        sVar6 = send(unaff_EBX,local_2e8,0x100,0);
        if (sVar6 == -1) {
          perror("send");
        }
        pollData[1] = (pollfd)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)(pollData + 1),"logout","");
        if (sUserInput._M_dataplus._M_p == local_70) {
          if (sUserInput._M_dataplus._M_p == (pointer)0x0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp(servinfo,(void *)pollData[1],(size_t)sUserInput._M_dataplus._M_p);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if (pollData[1] != (pollfd)local_68) {
          operator_delete((void *)pollData[1]);
        }
        if ((!bVar9) &&
           (lVar8 = std::__cxx11::string::find((char *)&servinfo,0x10309f,0), lVar8 != -1)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"> ",2);
          std::ostream::flush();
        }
        if (servinfo != (addrinfo *)&sUserInput._M_string_length) {
          operator_delete(servinfo);
        }
      } while (!bVar9);
      close(unaff_EBX);
      iVar3 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"client: failed to connect",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      iVar3 = 2;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"getaddrinfo: ",0xd);
    pcVar4 = gai_strerror(iVar3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106140);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[]){
    //lots of declaration with the socket code
    int sockfd, numbytes;
    char buf[MAXDATASIZE];
    struct addrinfo hints, *servinfo, *p;
    int rv;
    char s[INET6_ADDRSTRLEN];
    char userInput[MAXDATASIZE];
    struct pollfd pollData[2];


    if (argc != 2) {
        cerr << "usage: client hostname" << endl;
        exit(1);
    }

    memset(&hints, 0, sizeof hints);

    //Accpets both IPV4 and IPV6
    hints.ai_family = AF_UNSPEC;
    //Using the stream socket type
    hints.ai_socktype = SOCK_STREAM;

    if ((rv = getaddrinfo(argv[1], PORT, &hints, &servinfo)) != 0) {
        cerr << "getaddrinfo: " <<  gai_strerror(rv) << endl;
        return 1;
    }

    // loop through all the results and connect to the first we can
    for(p = servinfo; p != NULL; p = p->ai_next) {
        if ((sockfd = socket(p->ai_family, p->ai_socktype,
                p->ai_protocol)) == -1) {
            perror("client: socket");
            continue;
        }
        //connect to that socket
        if (connect(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
            close(sockfd);
            perror("client: connect");
            continue;
        }

        break;
    }

    if (p == NULL) {
        cerr << "client: failed to connect" << endl;
        return 2;
    }

    //Convert the binary address to string, Thanks to http://beej.us/guide/bgnet/output/html/multipage/clientserver.html
    // for the awsome function with all the bit operators, you da best
    inet_ntop(p->ai_family, get_in_addr((struct sockaddr *)p->ai_addr),
            s, sizeof s);
    //cout << "client: connecting to " <<  s << endl;

    freeaddrinfo(servinfo); // all done with this structure
    cout << "My chat room server. Version Two." << endl;




    //set everything up for stdin and sockect recv polling
    pollData[0].fd = sockfd;
    pollData[0].events = POLLIN;
    pollData[1].fd = fileno(stdin);
    pollData[1].events = POLLIN;


    while(1){

        //TODO finish polling
        rv = poll(pollData, 2, 500);

        if(rv == -1){
            perror("Polling error");
        }
        //check if there was some data recieved on stdin or the socket
        else if (rv != 0){
            //check if it was received on the socket
            if (pollData[0].revents & POLLIN) {
                bzero(buf,MAXDATASIZE);
                if ((numbytes = recv(sockfd, buf, MAXDATASIZE-1, 0)) == -1) {
                    perror("recv");
                    exit(1);
                }

                //add the nul terminator to stop the string of data
                buf[numbytes] = '\0';

                //if recieved actual data print it otherwise ignore it
                if(numbytes > 0){
                    //print out the message received from the serveer
                    cout << buf << endl << "> ";
                    //the last > gets caught if you don't flush standard out
                    cout.flush();
                }
            }
            else{
                // check if the user is typing on the command line
                string sUserInput;
                getline(cin,sUserInput);

                //copy it to a cstring
                strcpy (userInput, sUserInput.c_str());

                //send the input to the server
                if (send(sockfd, userInput, MAXDATASIZE, 0) == -1)
                    perror("send");
                //check if the user wants to log out
                if(sUserInput == string("logout")){
                    break;
                }
                //use this to fixed a missing > for the output
                else if(sUserInput.find("send") !=  string::npos){
                    cout << "> ";
                    cout.flush();
                }
            }
        }

    }

    //close the socket
    close(sockfd);

    return 0;
}